

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeTargetDepends.cxx
# Opt level: O3

void __thiscall
cmComputeTargetDepends::OptimizeLinkDependencies
          (cmComputeTargetDepends *this,cmGeneratorTarget *gt,cmGraphEdgeList *outputEdges,
          cmGraphEdgeList *inputEdges)

{
  size_t sVar1;
  key_type pcVar2;
  pointer pTVar3;
  _Base_ptr p_Var4;
  mapped_type *pmVar5;
  _Rb_tree_node_base *p_Var6;
  const_iterator cVar7;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var8;
  _Base_ptr p_Var9;
  _Base_ptr p_Var10;
  _Base_ptr p_Var11;
  pointer __x;
  pointer pcVar12;
  mapped_type index;
  mapped_type index_1;
  cmGeneratorTarget *dep;
  set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> emitted;
  key_type local_e8;
  pointer local_e0;
  cmComputeTargetDepends *local_d8;
  key_type local_d0;
  cmGraphEdge local_c8;
  undefined1 local_a8 [8];
  bool local_a0;
  bool local_9f;
  element_type *local_98;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_90;
  pointer local_78;
  cmGeneratorTarget *local_70;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>_>_>_>
  *local_68;
  _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
  local_60;
  
  local_60._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_60._M_impl.super__Rb_tree_header._M_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
  __x = (inputEdges->super_vector<cmGraphEdge,_std::allocator<cmGraphEdge>_>).
        super__Vector_base<cmGraphEdge,_std::allocator<cmGraphEdge>_>._M_impl.
        super__Vector_impl_data._M_start;
  pcVar12 = (inputEdges->super_vector<cmGraphEdge,_std::allocator<cmGraphEdge>_>).
            super__Vector_base<cmGraphEdge,_std::allocator<cmGraphEdge>_>._M_impl.
            super__Vector_impl_data._M_finish;
  local_d8 = this;
  local_70 = gt;
  local_60._M_impl.super__Rb_tree_header._M_header._M_right =
       local_60._M_impl.super__Rb_tree_header._M_header._M_left;
  if (__x != pcVar12) {
    local_78 = pcVar12;
    do {
      if (__x->Strong == true) {
        std::vector<cmGraphEdge,_std::allocator<cmGraphEdge>_>::push_back
                  (&outputEdges->super_vector<cmGraphEdge,_std::allocator<cmGraphEdge>_>,__x);
      }
      else {
        sVar1 = __x->Dest;
        local_e0 = (local_d8->SideEffects).
                   super__Vector_base<cmComputeTargetDepends::TargetSideEffects,_std::allocator<cmComputeTargetDepends::TargetSideEffects>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        pTVar3 = local_e0 + sVar1;
        for (p_Var6 = *(_Base_ptr *)((long)&local_e0[sVar1].CustomCommandSideEffects._M_t + 0x18);
            (_Rb_tree_header *)p_Var6 !=
            (_Rb_tree_header *)((long)&(pTVar3->CustomCommandSideEffects)._M_t + 8U);
            p_Var6 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var6)) {
          local_c8.Dest = *(size_t *)(p_Var6 + 1);
          pmVar5 = std::
                   map<const_cmGeneratorTarget_*,_unsigned_long,_std::less<const_cmGeneratorTarget_*>,_std::allocator<std::pair<const_cmGeneratorTarget_*const,_unsigned_long>_>_>
                   ::operator[](&this->TargetIndex,(key_type *)&local_c8);
          local_e8 = (key_type)*pmVar5;
          if (local_60._M_impl.super__Rb_tree_header._M_header._M_parent == (_Base_ptr)0x0) {
LAB_005a340a:
            std::
            _Rb_tree<unsigned_long,unsigned_long,std::_Identity<unsigned_long>,std::less<unsigned_long>,std::allocator<unsigned_long>>
            ::_M_insert_unique<unsigned_long_const&>
                      ((_Rb_tree<unsigned_long,unsigned_long,std::_Identity<unsigned_long>,std::less<unsigned_long>,std::allocator<unsigned_long>>
                        *)&local_60,(unsigned_long *)&local_e8);
            local_9f = __x->Cross;
            local_98 = (__x->Backtrace).super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.
                       TopEntry.
                       super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                       ._M_ptr;
            local_90._M_pi =
                 (__x->Backtrace).super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.
                 TopEntry.
                 super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi;
            if ((_Rb_tree_node_base *)local_90._M_pi != (_Rb_tree_node_base *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                *(int *)&((_Rb_tree_node_base *)local_90._M_pi)->_M_parent =
                     *(int *)&((_Rb_tree_node_base *)local_90._M_pi)->_M_parent + 1;
                UNLOCK();
              }
              else {
                *(int *)&((_Rb_tree_node_base *)local_90._M_pi)->_M_parent =
                     *(int *)&((_Rb_tree_node_base *)local_90._M_pi)->_M_parent + 1;
              }
            }
            local_a8 = (undefined1  [8])local_e8;
            local_a0 = false;
            std::vector<cmGraphEdge,_std::allocator<cmGraphEdge>_>::emplace_back<cmGraphEdge>
                      (&outputEdges->super_vector<cmGraphEdge,_std::allocator<cmGraphEdge>_>,
                       (cmGraphEdge *)local_a8);
            if ((_Rb_tree_node_base *)local_90._M_pi != (_Rb_tree_node_base *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_90._M_pi);
            }
          }
          else {
            p_Var4 = local_60._M_impl.super__Rb_tree_header._M_header._M_parent;
            p_Var11 = &local_60._M_impl.super__Rb_tree_header._M_header;
            do {
              p_Var10 = p_Var11;
              p_Var9 = p_Var4;
              pcVar2 = *(key_type *)(p_Var9 + 1);
              p_Var11 = p_Var9;
              if (pcVar2 < local_e8) {
                p_Var11 = p_Var10;
              }
              p_Var4 = (&p_Var9->_M_left)[pcVar2 < local_e8];
            } while ((&p_Var9->_M_left)[pcVar2 < local_e8] != (_Base_ptr)0x0);
            if ((_Rb_tree_header *)p_Var11 == &local_60._M_impl.super__Rb_tree_header)
            goto LAB_005a340a;
            if (pcVar2 < local_e8) {
              p_Var9 = p_Var10;
            }
            if (local_e8 < *(key_type *)(p_Var9 + 1)) goto LAB_005a340a;
          }
        }
        cmGeneratorTarget::GetAllConfigCompileLanguages_abi_cxx11_
                  ((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_a8,local_70);
        if ((_Rb_tree_node_base *)local_90._M_pi != (_Rb_tree_node_base *)&local_a0) {
          local_68 = &local_e0[sVar1].LanguageSideEffects;
          local_e0 = (pointer)((long)&local_e0[sVar1].LanguageSideEffects._M_t + 8);
          _Var8._M_pi = local_90._M_pi;
          do {
            cVar7 = std::
                    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>_>_>_>
                    ::find(&local_68->_M_t,(key_type *)((long)_Var8._M_pi + 0x20));
            if ((pointer)cVar7._M_node != local_e0) {
              for (p_Var6 = cVar7._M_node[2]._M_right;
                  p_Var6 != (_Rb_tree_node_base *)&cVar7._M_node[2]._M_parent;
                  p_Var6 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var6)) {
                local_e8 = *(key_type *)(p_Var6 + 1);
                pmVar5 = std::
                         map<const_cmGeneratorTarget_*,_unsigned_long,_std::less<const_cmGeneratorTarget_*>,_std::allocator<std::pair<const_cmGeneratorTarget_*const,_unsigned_long>_>_>
                         ::operator[](&this->TargetIndex,&local_e8);
                local_d0 = (key_type)*pmVar5;
                if (local_60._M_impl.super__Rb_tree_header._M_header._M_parent == (_Base_ptr)0x0) {
LAB_005a356c:
                  std::
                  _Rb_tree<unsigned_long,unsigned_long,std::_Identity<unsigned_long>,std::less<unsigned_long>,std::allocator<unsigned_long>>
                  ::_M_insert_unique<unsigned_long_const&>
                            ((_Rb_tree<unsigned_long,unsigned_long,std::_Identity<unsigned_long>,std::less<unsigned_long>,std::allocator<unsigned_long>>
                              *)&local_60,(unsigned_long *)&local_d0);
                  local_c8.Cross = __x->Cross;
                  local_c8.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.
                  TopEntry.
                  super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                  ._M_ptr = (__x->Backtrace).
                            super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
                            super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                            ._M_ptr;
                  local_c8.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.
                  TopEntry.
                  super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount._M_pi =
                       (__x->Backtrace).super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.
                       TopEntry.
                       super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                       ._M_refcount._M_pi;
                  if (local_c8.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.
                      TopEntry.
                      super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                    if (__libc_single_threaded == '\0') {
                      LOCK();
                      (local_c8.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>
                       .TopEntry.
                       super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                       ._M_refcount._M_pi)->_M_use_count =
                           (local_c8.Backtrace.
                            super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
                            super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                            ._M_refcount._M_pi)->_M_use_count + 1;
                      UNLOCK();
                    }
                    else {
                      (local_c8.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>
                       .TopEntry.
                       super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                       ._M_refcount._M_pi)->_M_use_count =
                           (local_c8.Backtrace.
                            super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
                            super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                            ._M_refcount._M_pi)->_M_use_count + 1;
                    }
                  }
                  local_c8.Dest = (size_t)local_d0;
                  local_c8.Strong = false;
                  std::vector<cmGraphEdge,_std::allocator<cmGraphEdge>_>::emplace_back<cmGraphEdge>
                            (&outputEdges->super_vector<cmGraphEdge,_std::allocator<cmGraphEdge>_>,
                             &local_c8);
                  if (local_c8.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.
                      TopEntry.
                      super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                              (local_c8.Backtrace.
                               super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
                               super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                               ._M_refcount._M_pi);
                  }
                }
                else {
                  p_Var4 = local_60._M_impl.super__Rb_tree_header._M_header._M_parent;
                  p_Var11 = &local_60._M_impl.super__Rb_tree_header._M_header;
                  do {
                    p_Var10 = p_Var11;
                    p_Var9 = p_Var4;
                    pcVar2 = *(key_type *)(p_Var9 + 1);
                    p_Var11 = p_Var9;
                    if (pcVar2 < local_d0) {
                      p_Var11 = p_Var10;
                    }
                    p_Var4 = (&p_Var9->_M_left)[pcVar2 < local_d0];
                  } while ((&p_Var9->_M_left)[pcVar2 < local_d0] != (_Base_ptr)0x0);
                  if ((_Rb_tree_header *)p_Var11 == &local_60._M_impl.super__Rb_tree_header)
                  goto LAB_005a356c;
                  if (pcVar2 < local_d0) {
                    p_Var9 = p_Var10;
                  }
                  if (local_d0 < *(key_type *)(p_Var9 + 1)) goto LAB_005a356c;
                }
              }
            }
            _Var8._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                          std::_Rb_tree_increment(_Var8._M_pi);
          } while ((_Rb_tree_node_base *)_Var8._M_pi != (_Rb_tree_node_base *)&local_a0);
        }
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_a8);
        pcVar12 = local_78;
      }
      __x = __x + 1;
    } while (__x != pcVar12);
  }
  std::
  _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
  ::~_Rb_tree(&local_60);
  return;
}

Assistant:

void cmComputeTargetDepends::OptimizeLinkDependencies(
  cmGeneratorTarget const* gt, cmGraphEdgeList& outputEdges,
  cmGraphEdgeList const& inputEdges)
{
  std::set<size_t> emitted;
  for (auto const& edge : inputEdges) {
    if (edge.IsStrong()) {
      // Preserve strong edges
      outputEdges.push_back(edge);
    } else {
      auto const& dse = this->SideEffects[edge];

      // Add edges that have custom command side effects
      for (cmGeneratorTarget const* dep : dse.CustomCommandSideEffects) {
        auto index = this->TargetIndex[dep];
        if (!emitted.count(index)) {
          emitted.insert(index);
          outputEdges.push_back(
            cmGraphEdge(index, false, edge.IsCross(), edge.GetBacktrace()));
        }
      }

      // Add edges that have language side effects for languages we
      // care about
      for (auto const& lang : gt->GetAllConfigCompileLanguages()) {
        auto it = dse.LanguageSideEffects.find(lang);
        if (it != dse.LanguageSideEffects.end()) {
          for (cmGeneratorTarget const* dep : it->second) {
            auto index = this->TargetIndex[dep];
            if (!emitted.count(index)) {
              emitted.insert(index);
              outputEdges.push_back(cmGraphEdge(index, false, edge.IsCross(),
                                                edge.GetBacktrace()));
            }
          }
        }
      }
    }
  }
}